

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.h
# Opt level: O1

void __thiscall libchars::edit_object::edit_object(edit_object *this,mode_e m,char *s)

{
  char *__dest;
  size_t sVar1;
  
  this->_vptr_edit_object = (_func_int **)&PTR__edit_object_00104d10;
  this->mode = m;
  (this->prompt)._M_dataplus._M_p = (pointer)&(this->prompt).field_2;
  (this->prompt)._M_string_length = 0;
  (this->prompt).field_2._M_local_buf[0] = '\0';
  __dest = this->buffer;
  if (s == (char *)0x0) {
    memset(__dest,0,0x4008);
  }
  else {
    strncpy(__dest,s,0x3fff);
    this->buffer[0x3fff] = '\0';
    sVar1 = strlen(__dest);
    this->buflen = sVar1;
  }
  this->cursor = 0;
  this->prompt_rendered = 0;
  this->insert_idx = this->buflen;
  return;
}

Assistant:

edit_object(mode_e m = MODE_STRING, const char *s = NULL) : mode(m) {
            if (s != NULL) {
                strncpy(buffer,s,sizeof(buffer)-1);
                buffer[sizeof(buffer) - 1] = 0;
                buflen = strlen(buffer);
            }
            else {
                memset(buffer, 0, sizeof(buffer));
                buflen = 0;
            }
            reset();
        }